

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_conversion.cpp
# Opt level: O0

crn_bool crnlib::texture_conversion::crn_progress_callback
                   (crn_uint32 phase_index,crn_uint32 total_phases,crn_uint32 subphase_index,
                   crn_uint32 total_subphases,void *pUser_data_ptr)

{
  int iVar1;
  ulong uVar2;
  int percentage_complete;
  progress_params *params;
  void *pUser_data_ptr_local;
  crn_uint32 total_subphases_local;
  crn_uint32 subphase_index_local;
  crn_uint32 total_phases_local;
  crn_uint32 phase_index_local;
  
  if ((*(byte *)((long)pUser_data_ptr + 0xc) & 1) == 0) {
    if (*(long *)(*pUser_data_ptr + 0x3f8) == 0) {
      total_phases_local = 1;
    }
    else {
      iVar1 = math::clamp<int>(*(uint *)((long)pUser_data_ptr + 8) +
                               (int)((((float)phase_index +
                                      (float)subphase_index / (float)total_subphases) *
                                     (100.0 - (float)*(uint *)((long)pUser_data_ptr + 8))) /
                                     (float)total_phases + 0.5),0,100);
      uVar2 = (**(code **)(*pUser_data_ptr + 0x3f8))(iVar1,*(undefined8 *)(*pUser_data_ptr + 0x400))
      ;
      if ((uVar2 & 1) == 0) {
        *(undefined1 *)((long)pUser_data_ptr + 0xc) = 1;
        total_phases_local = 0;
      }
      else {
        total_phases_local = 1;
      }
    }
  }
  else {
    total_phases_local = 0;
  }
  return total_phases_local;
}

Assistant:

static crn_bool crn_progress_callback(crn_uint32 phase_index, crn_uint32 total_phases, crn_uint32 subphase_index, crn_uint32 total_subphases, void* pUser_data_ptr)
        {
            progress_params& params = *static_cast<progress_params*>(pUser_data_ptr);

            if (params.m_canceled)
            {
                return false;
            }
            if (!params.m_pParams->m_pProgress_func)
            {
                return true;
            }

            int percentage_complete = params.m_start_percentage + (int)(.5f + (phase_index + float(subphase_index) / total_subphases) * (100.0f - params.m_start_percentage) / total_phases);

            percentage_complete = math::clamp<int>(percentage_complete, 0, 100);

            if (!params.m_pParams->m_pProgress_func(percentage_complete, params.m_pParams->m_pProgress_user_data))
            {
                params.m_canceled = true;
                return false;
            }

            return true;
        }